

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceSpot::~IfcLightSourceSpot(IfcLightSourceSpot *this)

{
  ~IfcLightSourceSpot((IfcLightSourceSpot *)
                      &this[-1].super_IfcLightSourcePositional.super_IfcLightSource.field_0x50);
  return;
}

Assistant:

IfcLightSourceSpot() : Object("IfcLightSourceSpot") {}